

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O2

Move * ddSiftingDown(DdManager *table,int x,int xHigh)

{
  int x_00;
  uint uVar1;
  DdHalfWord x_01;
  int iVar2;
  DdNode *pDVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  DdNode *pDVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  
  lVar5 = (long)x;
  x_00 = table->invperm[lVar5];
  uVar1 = table->keys;
  iVar11 = table->isolated;
  lVar9 = (long)xHigh;
  lVar8 = lVar9 * 0xe + 4;
  iVar6 = 0;
  for (lVar10 = lVar9; lVar5 < lVar10; lVar10 = lVar10 + -1) {
    iVar4 = table->invperm[lVar10];
    iVar2 = cuddTestInteract(table,x_00,iVar4);
    if (iVar2 != 0) {
      iVar6 = (iVar6 - (uint)(table->vars[iVar4]->ref == 1)) +
              *(int *)((long)&table->subtables->nodelist + lVar8 * 4);
    }
    lVar8 = lVar8 + -0xe;
  }
  iVar11 = uVar1 - iVar11;
  lVar10 = lVar5 * 0xe + 0x12;
  pDVar7 = (DdNode *)0x0;
  iVar4 = iVar11;
  while( true ) {
    if (lVar9 <= lVar5) {
      return (Move *)pDVar7;
    }
    if (iVar4 <= iVar11 - iVar6) break;
    iVar11 = table->invperm[lVar5 + 1];
    iVar2 = cuddTestInteract(table,x_00,iVar11);
    if (iVar2 != 0) {
      iVar6 = (iVar6 + (uint)(table->vars[iVar11]->ref == 1)) -
              *(int *)((long)&table->subtables->nodelist + lVar10 * 4);
    }
    x_01 = (DdHalfWord)lVar5;
    iVar11 = cuddSwapInPlace(table,x_01,x_01 + 1);
    if ((iVar11 == 0) || (pDVar3 = cuddDynamicAllocNode(table), pDVar3 == (DdNode *)0x0)) {
      while (pDVar7 != (DdNode *)0x0) {
        pDVar3 = (pDVar7->type).kids.T;
        pDVar7->ref = 0;
        pDVar7->next = table->nextFree;
        table->nextFree = pDVar7;
        pDVar7 = pDVar3;
      }
      return (Move *)0xffffffffffffffff;
    }
    pDVar3->index = x_01;
    pDVar3->ref = x_01 + 1;
    *(int *)((long)&pDVar3->next + 4) = iVar11;
    (pDVar3->type).kids.T = pDVar7;
    if ((double)iVar4 * table->maxGrowth < (double)iVar11) {
      return (Move *)pDVar3;
    }
    if (iVar11 < iVar4) {
      iVar4 = iVar11;
    }
    lVar5 = lVar5 + 1;
    lVar10 = lVar10 + 0xe;
    pDVar7 = pDVar3;
  }
  return (Move *)pDVar7;
}

Assistant:

static Move *
ddSiftingDown(
  DdManager * table,
  int  x,
  int  xHigh)
{
    Move        *moves;
    Move        *move;
    int         y;
    int         size;
    int         R;      /* upper bound on node decrease */
    int         limitSize;
    int         xindex, yindex;
    int         isolated;
#ifdef DD_DEBUG
    int         checkR;
    int         z;
    int         zindex;
#endif

    moves = NULL;
    /* Initialize R */
    xindex = table->invperm[x];
    limitSize = size = table->keys - table->isolated;
    R = 0;
    for (y = xHigh; y > x; y--) {
        yindex = table->invperm[y];
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[yindex]->ref == 1;
            R += table->subtables[y].keys - isolated;
        }
    }

    y = cuddNextHigh(table,x);
    while (y <= xHigh && size - R < limitSize) {
#ifdef DD_DEBUG
        checkR = 0;
        for (z = xHigh; z > x; z--) {
            zindex = table->invperm[z];
            if (cuddTestInteract(table,xindex,zindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkR += table->subtables[z].keys - isolated;
            }
        }
        assert(R == checkR);
#endif
        /* Update upper bound on node decrease. */
        yindex = table->invperm[y];
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[yindex]->ref == 1;
            R -= table->subtables[y].keys - isolated;
        }
        size = cuddSwapInPlace(table,x,y);
        if (size == 0) goto ddSiftingDownOutOfMem;
        move = (Move *) cuddDynamicAllocNode(table);
        if (move == NULL) goto ddSiftingDownOutOfMem;
        move->x = x;
        move->y = y;
        move->size = size;
        move->next = moves;
        moves = move;
        if ((double) size > (double) limitSize * table->maxGrowth) break;
        if (size < limitSize) limitSize = size;
        x = y;
        y = cuddNextHigh(table,x);
    }
    return(moves);

ddSiftingDownOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return((Move *) CUDD_OUT_OF_MEM);

}